

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O3

wchar_t canRunCommand(char *cmd)

{
  wchar_t wVar1;
  
  if (canRunCommand_tested == '\0') {
    canRunCommand_tested = '\x01';
    wVar1 = systemf("%s %s",cmd,">/dev/null 2>/dev/null");
    if (wVar1 == L'\0') {
      canRunCommand_value = 1;
    }
  }
  return (uint)canRunCommand_value;
}

Assistant:

int
canRunCommand(const char *cmd)
{
  static int tested = 0, value = 0;
  if (!tested) {
    tested = 1;
    if (systemf("%s %s", cmd, redirectArgs) == 0)
      value = 1;
  }
  return (value);
}